

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::WrapperOneofFieldGenerator::GenerateSerializationCode
          (WrapperOneofFieldGenerator *this,Printer *printer,bool use_write_context)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  string_view text;
  
  pcVar1 = 
  "if ($has_property_check$) {\n  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n}\n"
  ;
  if ((int)CONCAT71(in_register_00000011,use_write_context) != 0) {
    pcVar1 = 
    "if ($has_property_check$) {\n  _oneof_$name$_codec.WriteTagAndValue(ref output, ($type_name$) $oneof_name$_);\n}\n"
    ;
  }
  text._M_str = pcVar1;
  text._M_len = (CONCAT71(in_register_00000011,use_write_context) & 0xffffffff) * 4 + 0x6b;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.variables_,text);
  return;
}

Assistant:

void WrapperOneofFieldGenerator::GenerateSerializationCode(io::Printer* printer, bool use_write_context) {
  // TODO: I suspect this is wrong...
  printer->Print(
    variables_,
    use_write_context
    ? "if ($has_property_check$) {\n"
      "  _oneof_$name$_codec.WriteTagAndValue(ref output, ($type_name$) $oneof_name$_);\n"
      "}\n"
    : "if ($has_property_check$) {\n"
      "  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n"
      "}\n");
}